

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

_Bool savefile_load(char *path,_Bool cheat_death)

{
  ang_file *f_00;
  ang_file *f;
  _Bool ok;
  _Bool cheat_death_local;
  char *path_local;
  
  safe_setuid_grab();
  f_00 = file_open(path,MODE_READ,FTYPE_TEXT);
  safe_setuid_drop();
  if (f_00 == (ang_file *)0x0) {
    note("Couldn\'t open savefile.");
    path_local._7_1_ = false;
  }
  else {
    path_local._7_1_ = try_load(f_00,loaders);
    file_close(f_00);
    if (((player->is_dead & 1U) != 0) && (cheat_death)) {
      player->is_dead = false;
      player->chp = player->mhp;
      player->noscore = player->noscore | 2;
    }
    character_generated = true;
    player->upkeep->playing = true;
  }
  return path_local._7_1_;
}

Assistant:

bool savefile_load(const char *path, bool cheat_death)
{
	bool ok;
	ang_file *f;

	safe_setuid_grab();
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	safe_setuid_drop();
	if (!f) {
		note("Couldn't open savefile.");
		return false;
	}

	ok = try_load(f, loaders);
	file_close(f);

	if (player->is_dead && cheat_death) {
			player->is_dead = false;
			player->chp = player->mhp;
			player->noscore |= NOSCORE_WIZARD;
	}

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	return ok;
}